

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O3

int arkStep_SetNonlinRDiv(ARKodeMem ark_mem,sunrealtype rdiv)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem local_20;
  double local_18;
  
  local_18 = rdiv;
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_SetNonlinRDiv",&local_20);
  if (iVar1 == 0) {
    local_20->rdiv =
         (sunrealtype)
         (~-(ulong)(0.0 < local_18) & 0x4002666666666666 |
         (ulong)local_18 & -(ulong)(0.0 < local_18));
  }
  return iVar1;
}

Assistant:

int arkStep_SetNonlinRDiv(ARKodeMem ark_mem, sunrealtype rdiv)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if argument legal set it, otherwise set default */
  if (rdiv <= ZERO) { step_mem->rdiv = RDIV; }
  else { step_mem->rdiv = rdiv; }

  return (ARK_SUCCESS);
}